

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O3

void glmc_rotate_z(vec4 *m,float rad,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar14 = cosf(rad);
  fVar15 = sinf(rad);
  fVar1 = (*m)[0];
  fVar2 = (*m)[1];
  fVar3 = (*m)[2];
  fVar4 = (*m)[3];
  fVar5 = m[1][0];
  fVar6 = m[1][1];
  fVar7 = m[1][2];
  fVar8 = m[1][3];
  fVar9 = m[2][0];
  fVar10 = m[2][1];
  fVar11 = m[2][2];
  fVar12 = m[2][3];
  fVar16 = fVar9 * 0.0;
  fVar17 = fVar10 * 0.0;
  fVar18 = fVar11 * 0.0;
  fVar19 = fVar12 * 0.0;
  (*dest)[0] = fVar15 * fVar5 + fVar14 * fVar1 + fVar16;
  (*dest)[1] = fVar15 * fVar6 + fVar14 * fVar2 + fVar17;
  (*dest)[2] = fVar15 * fVar7 + fVar14 * fVar3 + fVar18;
  (*dest)[3] = fVar15 * fVar8 + fVar14 * fVar4 + fVar19;
  dest[1][0] = fVar16 + (fVar14 * fVar5 - fVar1 * fVar15);
  dest[1][1] = fVar17 + (fVar14 * fVar6 - fVar2 * fVar15);
  dest[1][2] = fVar18 + (fVar14 * fVar7 - fVar3 * fVar15);
  dest[1][3] = fVar19 + (fVar14 * fVar8 - fVar4 * fVar15);
  dest[2][0] = fVar5 * 0.0 + fVar1 * 0.0 + fVar9;
  dest[2][1] = fVar6 * 0.0 + fVar2 * 0.0 + fVar10;
  dest[2][2] = fVar7 * 0.0 + fVar3 * 0.0 + fVar11;
  dest[2][3] = fVar8 * 0.0 + fVar4 * 0.0 + fVar12;
  uVar13 = *(undefined8 *)(m[3] + 2);
  *(undefined8 *)dest[3] = *(undefined8 *)m[3];
  *(undefined8 *)(dest[3] + 2) = uVar13;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_z(mat4 m, float rad, mat4 dest) {
  glm_rotate_z(m, rad, dest);
}